

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
SortableOIDType::generateSortingMap
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          SortableOIDType *this)

{
  size_type sVar1;
  uchar *puVar2;
  size_t local_58;
  size_t local_50;
  size_t len;
  long item;
  uint8_t *puStack_38;
  int i;
  uint8_t *ptr;
  undefined1 local_19;
  SortableOIDType *local_18;
  SortableOIDType *this_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *map;
  
  local_19 = 0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = this;
  this_local = (SortableOIDType *)__return_storage_ptr__;
  Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&(this->super_OIDType).data);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(__return_storage_ptr__,sVar1);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (&(this->super_OIDType).data);
  puStack_38 = puVar2 + 1;
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&(this->super_OIDType).data);
  item._4_4_ = (int)sVar1 + -1;
  while (0 < item._4_4_) {
    local_50 = decode_ber_longform_integer(puStack_38,(long *)&len,item._4_4_);
    puStack_38 = puStack_38 + local_50;
    item._4_4_ = item._4_4_ - (int)local_50;
    local_58 = len;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (__return_storage_ptr__,&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<unsigned long> SortableOIDType::generateSortingMap() const {
    auto map = std::vector<unsigned long>();

    // maybe anice midway between speed and size?
    map.reserve(this->data.size() * 1);

    const uint8_t* ptr = this->data.data();

    ptr += 1; // skip to start of interesting differences
    int i = this->data.size() - 1;

    while(i > 0){
        long item;
        size_t len = decode_ber_longform_integer(ptr, &item, i);
        ptr += len; i -= len;
        map.push_back(item);
    }

    return map;
}